

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decide.cpp
# Opt level: O0

int dcmp(double x)

{
  double x_local;
  undefined4 local_4;
  
  if (x <= 1e-09) {
    if (-1e-09 <= x) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int dcmp(double x)
{
    if (x > eps)
        return 1;
    else if (x < -eps)
        return -1;
    else
        return 0;
}